

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  long lVar4;
  long lVar5;
  pointer __src;
  long lVar6;
  
  ppTVar2 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)ppTVar3 - (long)ppTVar2 != 0) {
    lVar4 = (long)ppTVar3 - (long)ppTVar2 >> 3;
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (ppTVar2[lVar6] == listener) {
        __src = (pointer)((long)ppTVar2 + (lVar5 >> 0x1d) + 8);
        if (__src != ppTVar3) {
          memmove((void *)((long)ppTVar2 + (lVar5 >> 0x1d)),__src,(long)ppTVar3 - (long)__src);
        }
        pppTVar1 = &(this->listeners_).
                    super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + -1;
        return listener;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x100000000;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
  }
  return (TestEventListener *)0x0;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener *listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + static_cast<int>(i));
      return listener;
    }
  }

  return nullptr;
}